

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O1

void __thiscall fizplex::ColMatrix_SwapColumns_Test::TestBody(ColMatrix_SwapColumns_Test *this)

{
  void *pvVar1;
  bool bVar2;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *pvVar3;
  SVector *pSVar4;
  long lVar5;
  char *pcVar6;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  SVector v0;
  ColMatrix m;
  SVector v2;
  AssertHelper local_110;
  Nonzero local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Nonzero local_e8;
  undefined8 local_d8;
  undefined1 *apuStack_d0 [2];
  long lStack_c0;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> local_b8;
  SVector local_a0;
  SVector local_88;
  ColMatrix local_70;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_f8 = 2;
  uStack_f0 = 0xc008000000000000;
  local_108.index = 0;
  local_108.value = 7.0;
  l._M_len = 2;
  l._M_array = &local_108;
  SVector::SVector((SVector *)&local_b8,l);
  local_28 = 2;
  uStack_20 = 0x4010000000000000;
  local_48.super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  uStack_30 = 0x4008000000000000;
  local_48.super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&local_48;
  SVector::SVector(&local_a0,l_00);
  apuStack_d0[1] = (undefined1 *)0x2;
  lStack_c0 = -0x4000000000000000;
  local_d8 = 1;
  apuStack_d0[0] = &DAT_bff0000000000000;
  local_e8.index = 0;
  local_e8.value = (double)&DAT_3ff0000000000000;
  l_01._M_len = 3;
  l_01._M_array = &local_e8;
  SVector::SVector(&local_88,l_01);
  colList._M_len = 3;
  colList._M_array = (iterator)&local_b8;
  ColMatrix::ColMatrix(&local_70,3,3,colList);
  lVar5 = 0x48;
  do {
    pvVar1 = *(void **)((long)apuStack_d0 + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_c0 + lVar5) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  pvVar3 = &ColMatrix::column(&local_70,0)->values;
  std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
            (&local_b8,pvVar3);
  pvVar3 = &ColMatrix::column(&local_70,2)->values;
  std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
            (&local_48,pvVar3);
  ColMatrix::swap_columns(&local_70,0,2);
  pSVar4 = ColMatrix::column(&local_70,0);
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&local_e8,"v2","m.column(0)",(SVector *)&local_48,pSVar4);
  if ((char)local_e8.index == '\0') {
    testing::Message::Message((Message *)&local_108);
    if ((undefined8 *)local_e8.value == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_e8.value;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x54,pcVar6);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.index != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_108.index != (long *)0x0)) {
        (**(code **)(*(long *)local_108.index + 8))();
      }
      local_108.index = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  pSVar4 = ColMatrix::column(&local_70,2);
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&local_e8,"v0","m.column(2)",(SVector *)&local_b8,pSVar4);
  if ((char)local_e8.index == '\0') {
    testing::Message::Message((Message *)&local_108);
    if ((undefined8 *)local_e8.value == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_e8.value;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x55,pcVar6);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_108.index != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_108.index != (long *)0x0)) {
        (**(code **)(*(long *)local_108.index + 8))();
      }
      local_108.index = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_48.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_70.cols);
  return;
}

Assistant:

TEST(ColMatrix, SwapColumns) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector v0 = m.column(0);
  const SVector v2 = m.column(2);
  m.swap_columns(0, 2);
  EXPECT_EQ(v2, m.column(0));
  EXPECT_EQ(v0, m.column(2));
}